

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::RleBpEncoder::WriteMany(RleBpEncoder *this,WriteStream *writer,uint32_t value,idx_t count)

{
  RleBpEncoder *in_RCX;
  undefined4 in_EDX;
  WriteStream *in_RDI;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    WriteValue(in_RCX,in_RDI,
               (uint32_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    in_RCX = (RleBpEncoder *)((long)&in_RCX[-1].bp_block_count + 7);
  }
  if (*(long *)(in_RDI + 0x818) != 0) {
    for (; *(long *)(in_RDI + 0x818) != 0 && in_RCX != (RleBpEncoder *)0x0;
        in_RCX = (RleBpEncoder *)((long)&in_RCX[-1].bp_block_count + 7)) {
      WriteValue(in_RCX,in_RDI,
                 (uint32_t *)
                 CONCAT17(*(long *)(in_RDI + 0x818) != 0 && in_RCX != (RleBpEncoder *)0x0,
                          in_stack_ffffffffffffffd0));
    }
  }
  *(undefined4 *)(in_RDI + 8) = in_EDX;
  *(long *)(in_RDI + 0x10) = (long)in_RCX->bp_block + *(long *)(in_RDI + 0x10) + -0x18;
  return;
}

Assistant:

void WriteMany(WriteStream &writer, uint32_t value, idx_t count) {
		if (rle_count != 0) {
			// If an RLE run is going on, write a single value to either finish it or convert to BP
			WriteValue(writer, value);
			count--;
		}

		if (bp_block_count != 0) {
			// If a BP run is going on, finish it
			while (bp_block_count != 0 && count > 0) {
				WriteValue(writer, value);
				count--;
			}
		}

		// Set remaining as current RLE run
		rle_value = value;
		rle_count += count;
	}